

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O1

void secp256k1_ecmult_table_get_ge_storage(secp256k1_ge *r,secp256k1_ge_storage *pre,int n,int w)

{
  uint64_t *puVar1;
  bool bVar2;
  bool bVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  int iVar7;
  ulong uVar8;
  byte bVar9;
  uint uVar10;
  undefined4 in_register_0000000c;
  int extraout_EDX;
  uint uVar11;
  uint extraout_EDX_00;
  secp256k1_ge *a;
  ulong uVar12;
  secp256k1_ge *a_00;
  secp256k1_fe *a_01;
  secp256k1_gej *psVar13;
  ulong uVar14;
  secp256k1_gej *psVar15;
  secp256k1_gej *r_00;
  ulong uVar16;
  secp256k1_gej *r_01;
  secp256k1_gej *a_02;
  secp256k1_ge *a_03;
  ulong uVar17;
  ulong uVar18;
  secp256k1_gej *a_04;
  secp256k1_fe *psVar19;
  secp256k1_gej *a_05;
  secp256k1_fe sStack_338;
  secp256k1_fe sStack_308;
  ulong uStack_2d8;
  secp256k1_gej *psStack_2d0;
  secp256k1_fe *psStack_2c8;
  ulong uStack_2c0;
  secp256k1_gej *psStack_2b8;
  secp256k1_gej *psStack_2a8;
  secp256k1_gej *psStack_2a0;
  secp256k1_gej *psStack_298;
  code *pcStack_290;
  int iStack_284;
  secp256k1_gej *psStack_280;
  secp256k1_fe *psStack_278;
  secp256k1_fe *psStack_268;
  undefined1 auStack_260 [56];
  uint64_t uStack_228;
  uint64_t uStack_220;
  uint64_t uStack_218;
  ulong uStack_210;
  ulong uStack_208;
  undefined1 auStack_200 [56];
  uint64_t uStack_1c8;
  uint64_t uStack_1c0;
  uint64_t uStack_1b8;
  ulong uStack_1b0;
  ulong uStack_1a8;
  undefined1 auStack_1a0 [56];
  uint64_t uStack_168;
  uint64_t uStack_160;
  uint64_t uStack_158;
  uint64_t uStack_150;
  int iStack_148;
  secp256k1_fe sStack_140;
  secp256k1_fe sStack_110;
  secp256k1_fe sStack_e0;
  secp256k1_fe sStack_b0;
  uint64_t uStack_80;
  uint64_t uStack_78;
  uint64_t uStack_70;
  uint64_t uStack_68;
  secp256k1_fe *psStack_60;
  int iStack_58;
  int iStack_54;
  
  psVar19 = (secp256k1_fe *)CONCAT44(in_register_0000000c,w);
  if ((n & 1U) == 0) {
    secp256k1_ecmult_table_get_ge_storage_cold_3();
LAB_00148a74:
    secp256k1_ecmult_table_get_ge_storage_cold_1();
  }
  else {
    if (n < -0x3fff) goto LAB_00148a74;
    if (n < 0x4000) {
      if (0 < n) {
        secp256k1_ge_from_storage(r,pre + (n - 1U >> 1));
        return;
      }
      secp256k1_ge_from_storage(r,pre + ((uint)~n >> 1));
      psVar19 = &r->y;
      secp256k1_fe_verify(psVar19);
      secp256k1_fe_verify_magnitude(psVar19,1);
      uVar4 = (r->y).n[1];
      uVar5 = (r->y).n[2];
      uVar6 = (r->y).n[3];
      (r->y).n[0] = 0x3ffffbfffff0bc - (r->y).n[0];
      (r->y).n[1] = 0x3ffffffffffffc - uVar4;
      (r->y).n[2] = 0x3ffffffffffffc - uVar5;
      (r->y).n[3] = 0x3ffffffffffffc - uVar6;
      (r->y).n[4] = 0x3fffffffffffc - (r->y).n[4];
      (r->y).magnitude = 2;
      (r->y).normalized = 0;
      secp256k1_fe_verify(psVar19);
      return;
    }
  }
  secp256k1_ecmult_table_get_ge_storage_cold_2();
  psStack_278 = (secp256k1_fe *)0x148aa3;
  secp256k1_gej_verify((secp256k1_gej *)pre);
  psStack_278 = (secp256k1_fe *)0x148aab;
  secp256k1_ge_verify(a);
  psStack_278 = (secp256k1_fe *)0x148ab3;
  secp256k1_fe_verify(psVar19);
  if (((secp256k1_gej *)pre)->infinity != 0) {
    ((secp256k1_gej *)r)->infinity = a->infinity;
    psStack_278 = (secp256k1_fe *)0x148adf;
    secp256k1_fe_sqr(&sStack_140,psVar19);
    psStack_278 = (secp256k1_fe *)0x148af5;
    secp256k1_fe_mul(&sStack_b0,&sStack_140,psVar19);
    psStack_278 = (secp256k1_fe *)0x148b03;
    secp256k1_fe_mul(&r->x,&a->x,&sStack_140);
    psStack_278 = (secp256k1_fe *)0x148b16;
    secp256k1_fe_mul(&((secp256k1_gej *)r)->y,&a->y,&sStack_b0);
    pre = (secp256k1_ge_storage *)&((secp256k1_gej *)r)->z;
    (((secp256k1_gej *)r)->z).n[0] = 1;
    (((secp256k1_gej *)r)->z).n[1] = 0;
    (((secp256k1_gej *)r)->z).n[2] = 0;
    (((secp256k1_gej *)r)->z).n[3] = 0;
    (((secp256k1_gej *)r)->z).n[4] = 0;
    (((secp256k1_gej *)r)->z).magnitude = 1;
    (((secp256k1_gej *)r)->z).normalized = 1;
LAB_00148b41:
    psStack_278 = (secp256k1_fe *)0x148b46;
    secp256k1_fe_verify((secp256k1_fe *)pre);
    psStack_278 = (secp256k1_fe *)0x148b4e;
    secp256k1_gej_verify((secp256k1_gej *)r);
    return;
  }
  if (a->infinity != 0) {
    memcpy(r,pre,0x98);
    return;
  }
  psStack_268 = &((secp256k1_gej *)pre)->z;
  psStack_278 = (secp256k1_fe *)0x148ba5;
  secp256k1_fe_mul(&sStack_140,psStack_268,psVar19);
  psVar19 = &sStack_b0;
  psStack_278 = (secp256k1_fe *)0x148bb8;
  secp256k1_fe_sqr(psVar19,&sStack_140);
  sStack_e0.n[0] = (((secp256k1_gej *)pre)->x).n[0];
  sStack_e0.n[1] = (((secp256k1_gej *)pre)->x).n[1];
  sStack_e0.n[2] = (((secp256k1_gej *)pre)->x).n[2];
  sStack_e0.n[3] = (((secp256k1_gej *)pre)->x).n[3];
  sStack_e0.n[4] = (((secp256k1_gej *)pre)->x).n[4];
  sStack_e0.magnitude = (((secp256k1_gej *)pre)->x).magnitude;
  sStack_e0.normalized = (((secp256k1_gej *)pre)->x).normalized;
  a_01 = &sStack_e0;
  psStack_278 = (secp256k1_fe *)0x148bed;
  secp256k1_fe_mul((secp256k1_fe *)(auStack_1a0 + 0x30),&a->x,psVar19);
  auStack_200._0_8_ = (((secp256k1_gej *)pre)->y).n[0];
  auStack_200._8_8_ = (((secp256k1_gej *)pre)->y).n[1];
  auStack_200._16_8_ = (((secp256k1_gej *)pre)->y).n[2];
  auStack_200._24_8_ = (((secp256k1_gej *)pre)->y).n[3];
  auStack_200._32_8_ = (((secp256k1_gej *)pre)->y).n[4];
  auStack_200._40_4_ = (((secp256k1_gej *)pre)->y).magnitude;
  auStack_200._44_4_ = (((secp256k1_gej *)pre)->y).normalized;
  psStack_278 = (secp256k1_fe *)0x148c2b;
  secp256k1_fe_mul(&sStack_110,&a->y,psVar19);
  psStack_278 = (secp256k1_fe *)0x148c3e;
  secp256k1_fe_mul(&sStack_110,&sStack_110,&sStack_140);
  psStack_278 = (secp256k1_fe *)0x148c46;
  secp256k1_fe_verify(a_01);
  psVar13 = (secp256k1_gej *)0x4;
  psStack_278 = (secp256k1_fe *)0x148c53;
  secp256k1_fe_verify_magnitude(a_01,4);
  auStack_200._48_8_ = 0x9ffff5ffffd9d6 - sStack_e0.n[0];
  uStack_1c8 = 0x9ffffffffffff6 - sStack_e0.n[1];
  a_05 = (secp256k1_gej *)(auStack_200 + 0x30);
  uStack_1c0 = 0x9ffffffffffff6 - sStack_e0.n[2];
  uStack_1b8 = 0x9ffffffffffff6 - sStack_e0.n[3];
  uStack_1b0 = 0x9fffffffffff6 - sStack_e0.n[4];
  uStack_1a8 = 5;
  psStack_278 = (secp256k1_fe *)0x148ca2;
  secp256k1_fe_verify((secp256k1_fe *)a_05);
  psStack_278 = (secp256k1_fe *)0x148caa;
  secp256k1_fe_verify((secp256k1_fe *)a_05);
  a_04 = (secp256k1_gej *)(auStack_1a0 + 0x30);
  psStack_278 = (secp256k1_fe *)0x148cba;
  r_00 = a_04;
  secp256k1_fe_verify((secp256k1_fe *)a_04);
  if (iStack_148 + (int)uStack_1a8 < 0x21) {
    auStack_200._48_8_ = auStack_200._48_8_ + auStack_1a0._48_8_;
    uStack_1c8 = uStack_1c8 + uStack_168;
    uStack_1c0 = uStack_1c0 + uStack_160;
    uStack_1b8 = uStack_1b8 + uStack_158;
    uStack_1b0 = uStack_1b0 + uStack_150;
    psVar19 = (secp256k1_fe *)0x3fffffffffffc;
    uStack_1a8 = (ulong)(uint)(iStack_148 + (int)uStack_1a8);
    psStack_278 = (secp256k1_fe *)0x148d1d;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_200 + 0x30));
    psStack_278 = (secp256k1_fe *)0x148d2d;
    secp256k1_fe_verify(&sStack_110);
    psVar13 = (secp256k1_gej *)0x1;
    psStack_278 = (secp256k1_fe *)0x148d3a;
    secp256k1_fe_verify_magnitude(&sStack_110,1);
    auStack_260._48_8_ = 0x3ffffbfffff0bc - sStack_110.n[0];
    uStack_228 = 0x3ffffffffffffc - sStack_110.n[1];
    a_04 = (secp256k1_gej *)(auStack_260 + 0x30);
    uStack_220 = 0x3ffffffffffffc - sStack_110.n[2];
    uStack_218 = 0x3ffffffffffffc - sStack_110.n[3];
    uStack_210 = 0x3fffffffffffc - sStack_110.n[4];
    uStack_208 = 2;
    psStack_278 = (secp256k1_fe *)0x148d84;
    secp256k1_fe_verify((secp256k1_fe *)a_04);
    psStack_278 = (secp256k1_fe *)0x148d8c;
    secp256k1_fe_verify((secp256k1_fe *)a_04);
    a_05 = (secp256k1_gej *)auStack_200;
    psStack_278 = (secp256k1_fe *)0x148d99;
    r_00 = a_05;
    secp256k1_fe_verify((secp256k1_fe *)a_05);
    if (0x20 < auStack_200._40_4_ + (int)uStack_208) goto LAB_00149265;
    auStack_260._48_8_ = auStack_260._48_8_ + auStack_200._0_8_;
    uStack_228 = uStack_228 + auStack_200._8_8_;
    uStack_220 = uStack_220 + auStack_200._16_8_;
    uStack_218 = uStack_218 + auStack_200._24_8_;
    uStack_210 = uStack_210 + auStack_200._32_8_;
    uStack_208 = (ulong)(uint)(auStack_200._40_4_ + (int)uStack_208);
    psStack_278 = (secp256k1_fe *)0x148e00;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_260 + 0x30));
    psStack_278 = (secp256k1_fe *)0x148e10;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_200 + 0x30));
    a_01 = (secp256k1_fe *)0x1000003d1;
    uVar8 = (uStack_1b0 >> 0x30) * 0x1000003d1 + auStack_200._48_8_;
    if (((uVar8 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar8 & 0xfffffffffffff) == 0)) {
      uVar12 = (uVar8 >> 0x34) + uStack_1c8;
      uVar14 = (uVar12 >> 0x34) + uStack_1c0;
      uVar16 = (uVar14 >> 0x34) + uStack_1b8;
      uVar17 = (uVar16 >> 0x34) + (uStack_1b0 & 0xffffffffffff);
      if ((((uVar12 | uVar8 | uVar14 | uVar16) & 0xfffffffffffff) == 0 && uVar17 == 0) ||
         (((uVar8 | 0x1000003d0) & uVar12 & uVar14 & uVar16 & (uVar17 ^ 0xf000000000000)) ==
          0xfffffffffffff)) {
        psStack_278 = (secp256k1_fe *)0x1491a2;
        secp256k1_fe_verify((secp256k1_fe *)(auStack_260 + 0x30));
        uVar8 = (uStack_210 >> 0x30) * 0x1000003d1 + auStack_260._48_8_;
        if (((uVar8 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar8 & 0xfffffffffffff) == 0)) {
          uVar12 = (uVar8 >> 0x34) + uStack_228;
          uVar14 = (uVar12 >> 0x34) + uStack_220;
          uVar16 = (uVar14 >> 0x34) + uStack_218;
          uVar17 = (uVar16 >> 0x34) + (uStack_210 & 0xffffffffffff);
          if ((((uVar12 | uVar8 | uVar14 | uVar16) & 0xfffffffffffff) == 0 && uVar17 == 0) ||
             (((uVar8 | 0x1000003d0) & uVar12 & uVar14 & uVar16 & (uVar17 ^ 0xf000000000000)) ==
              0xfffffffffffff)) {
            psStack_278 = (secp256k1_fe *)0x14925b;
            secp256k1_gej_double_var((secp256k1_gej *)r,(secp256k1_gej *)pre,(secp256k1_fe *)0x0);
            return;
          }
        }
        psStack_278 = (secp256k1_fe *)0x149249;
        secp256k1_gej_set_infinity((secp256k1_gej *)r);
        return;
      }
    }
    ((secp256k1_gej *)r)->infinity = 0;
    a_05 = (secp256k1_gej *)(auStack_200 + 0x30);
    psStack_278 = (secp256k1_fe *)0x148eed;
    secp256k1_fe_mul(&((secp256k1_gej *)r)->z,psStack_268,(secp256k1_fe *)a_05);
    pre = (secp256k1_ge_storage *)&stack0xffffffffffffff80;
    psStack_278 = (secp256k1_fe *)0x148f00;
    secp256k1_fe_sqr((secp256k1_fe *)pre,(secp256k1_fe *)a_05);
    psStack_278 = (secp256k1_fe *)0x148f08;
    secp256k1_fe_verify((secp256k1_fe *)pre);
    psStack_278 = (secp256k1_fe *)0x148f15;
    secp256k1_fe_verify_magnitude((secp256k1_fe *)pre,1);
    uStack_80 = 0x3ffffbfffff0bc - uStack_80;
    uStack_78 = 0x3ffffffffffffc - uStack_78;
    uStack_70 = 0x3ffffffffffffc - uStack_70;
    uStack_68 = 0x3ffffffffffffc - uStack_68;
    psVar19 = (secp256k1_fe *)(0x3fffffffffffc - (long)psStack_60);
    iStack_58 = 2;
    iStack_54 = 0;
    psStack_278 = (secp256k1_fe *)0x148f53;
    psStack_60 = psVar19;
    secp256k1_fe_verify((secp256k1_fe *)pre);
    a_04 = (secp256k1_gej *)auStack_260;
    psStack_278 = (secp256k1_fe *)0x148f66;
    secp256k1_fe_mul((secp256k1_fe *)a_04,(secp256k1_fe *)pre,(secp256k1_fe *)a_05);
    psStack_278 = (secp256k1_fe *)0x148f7e;
    secp256k1_fe_mul((secp256k1_fe *)auStack_1a0,&sStack_e0,(secp256k1_fe *)pre);
    psVar13 = (secp256k1_gej *)(auStack_260 + 0x30);
    psStack_278 = (secp256k1_fe *)0x148f8b;
    secp256k1_fe_sqr(&r->x,(secp256k1_fe *)psVar13);
    psStack_278 = (secp256k1_fe *)0x148f93;
    secp256k1_fe_verify(&r->x);
    psStack_278 = (secp256k1_fe *)0x148f9b;
    r_00 = a_04;
    secp256k1_fe_verify((secp256k1_fe *)a_04);
    iVar7 = auStack_260._40_4_ + (((secp256k1_gej *)r)->x).magnitude;
    if (0x20 < iVar7) goto LAB_0014926a;
    uVar4 = (((secp256k1_gej *)r)->x).n[1];
    uVar5 = (((secp256k1_gej *)r)->x).n[2];
    uVar6 = (((secp256k1_gej *)r)->x).n[3];
    (((secp256k1_gej *)r)->x).n[0] = (((secp256k1_gej *)r)->x).n[0] + auStack_260._0_8_;
    (((secp256k1_gej *)r)->x).n[1] = uVar4 + auStack_260._8_8_;
    (((secp256k1_gej *)r)->x).n[2] = uVar5 + auStack_260._16_8_;
    (((secp256k1_gej *)r)->x).n[3] = uVar6 + auStack_260._24_8_;
    puVar1 = (((secp256k1_gej *)r)->x).n + 4;
    *puVar1 = *puVar1 + auStack_260._32_8_;
    (((secp256k1_gej *)r)->x).magnitude = iVar7;
    (((secp256k1_gej *)r)->x).normalized = 0;
    psStack_278 = (secp256k1_fe *)0x148fe5;
    secp256k1_fe_verify(&r->x);
    psStack_278 = (secp256k1_fe *)0x148fed;
    secp256k1_fe_verify(&r->x);
    pre = (secp256k1_ge_storage *)auStack_1a0;
    psStack_278 = (secp256k1_fe *)0x148ffd;
    r_00 = (secp256k1_gej *)pre;
    secp256k1_fe_verify((secp256k1_fe *)pre);
    iVar7 = auStack_1a0._40_4_ + (((secp256k1_gej *)r)->x).magnitude;
    if (0x20 < iVar7) goto LAB_0014926f;
    uVar4 = (((secp256k1_gej *)r)->x).n[1];
    uVar5 = (((secp256k1_gej *)r)->x).n[2];
    uVar6 = (((secp256k1_gej *)r)->x).n[3];
    pre = (secp256k1_ge_storage *)auStack_1a0;
    (((secp256k1_gej *)r)->x).n[0] = (((secp256k1_gej *)r)->x).n[0] + auStack_1a0._0_8_;
    (((secp256k1_gej *)r)->x).n[1] = uVar4 + auStack_1a0._8_8_;
    (((secp256k1_gej *)r)->x).n[2] = uVar5 + auStack_1a0._16_8_;
    (((secp256k1_gej *)r)->x).n[3] = uVar6 + auStack_1a0._24_8_;
    puVar1 = (((secp256k1_gej *)r)->x).n + 4;
    *puVar1 = *puVar1 + auStack_1a0._32_8_;
    (((secp256k1_gej *)r)->x).magnitude = iVar7;
    (((secp256k1_gej *)r)->x).normalized = 0;
    psStack_278 = (secp256k1_fe *)0x14904c;
    secp256k1_fe_verify(&r->x);
    psStack_278 = (secp256k1_fe *)0x149054;
    secp256k1_fe_verify(&r->x);
    psStack_278 = (secp256k1_fe *)0x14905c;
    r_00 = (secp256k1_gej *)pre;
    secp256k1_fe_verify((secp256k1_fe *)pre);
    iVar7 = auStack_1a0._40_4_ + (((secp256k1_gej *)r)->x).magnitude;
    if (0x20 < iVar7) goto LAB_00149274;
    uVar4 = (((secp256k1_gej *)r)->x).n[1];
    uVar5 = (((secp256k1_gej *)r)->x).n[2];
    uVar6 = (((secp256k1_gej *)r)->x).n[3];
    pre = (secp256k1_ge_storage *)auStack_1a0;
    (((secp256k1_gej *)r)->x).n[0] = (((secp256k1_gej *)r)->x).n[0] + auStack_1a0._0_8_;
    (((secp256k1_gej *)r)->x).n[1] = uVar4 + auStack_1a0._8_8_;
    (((secp256k1_gej *)r)->x).n[2] = uVar5 + auStack_1a0._16_8_;
    (((secp256k1_gej *)r)->x).n[3] = uVar6 + auStack_1a0._24_8_;
    puVar1 = (((secp256k1_gej *)r)->x).n + 4;
    *puVar1 = *puVar1 + auStack_1a0._32_8_;
    (((secp256k1_gej *)r)->x).magnitude = iVar7;
    (((secp256k1_gej *)r)->x).normalized = 0;
    psStack_278 = (secp256k1_fe *)0x1490ab;
    secp256k1_fe_verify(&r->x);
    psStack_278 = (secp256k1_fe *)0x1490b3;
    secp256k1_fe_verify((secp256k1_fe *)pre);
    psStack_278 = (secp256k1_fe *)0x1490bb;
    r_00 = (secp256k1_gej *)r;
    secp256k1_fe_verify(&r->x);
    iVar7 = (((secp256k1_gej *)r)->x).magnitude + auStack_1a0._40_4_;
    if (0x20 < iVar7) goto LAB_00149279;
    auStack_1a0._0_8_ = (((secp256k1_gej *)r)->x).n[0] + auStack_1a0._0_8_;
    auStack_1a0._8_8_ = (((secp256k1_gej *)r)->x).n[1] + auStack_1a0._8_8_;
    auStack_1a0._16_8_ = (((secp256k1_gej *)r)->x).n[2] + auStack_1a0._16_8_;
    auStack_1a0._24_8_ = (((secp256k1_gej *)r)->x).n[3] + auStack_1a0._24_8_;
    auStack_1a0._32_8_ = auStack_1a0._32_8_ + (((secp256k1_gej *)r)->x).n[4];
    auStack_1a0._44_4_ = 0;
    psStack_278 = (secp256k1_fe *)0x14910e;
    auStack_1a0._40_4_ = iVar7;
    secp256k1_fe_verify((secp256k1_fe *)auStack_1a0);
    pre = (secp256k1_ge_storage *)&((secp256k1_gej *)r)->y;
    psStack_278 = (secp256k1_fe *)0x149122;
    secp256k1_fe_mul((secp256k1_fe *)pre,(secp256k1_fe *)auStack_1a0,
                     (secp256k1_fe *)(auStack_260 + 0x30));
    a_05 = (secp256k1_gej *)auStack_260;
    psStack_278 = (secp256k1_fe *)0x149137;
    psVar13 = a_05;
    secp256k1_fe_mul((secp256k1_fe *)a_05,(secp256k1_fe *)a_05,(secp256k1_fe *)auStack_200);
    psStack_278 = (secp256k1_fe *)0x14913f;
    secp256k1_fe_verify((secp256k1_fe *)pre);
    psStack_278 = (secp256k1_fe *)0x149147;
    r_00 = a_05;
    secp256k1_fe_verify((secp256k1_fe *)a_05);
    iVar7 = auStack_260._40_4_ + (((secp256k1_gej *)r)->y).magnitude;
    if (iVar7 < 0x21) {
      uVar4 = (((secp256k1_gej *)r)->y).n[1];
      uVar5 = (((secp256k1_gej *)r)->y).n[2];
      uVar6 = (((secp256k1_gej *)r)->y).n[3];
      (((secp256k1_gej *)r)->y).n[0] = (((secp256k1_gej *)r)->y).n[0] + auStack_260._0_8_;
      (((secp256k1_gej *)r)->y).n[1] = uVar4 + auStack_260._8_8_;
      (((secp256k1_gej *)r)->y).n[2] = uVar5 + auStack_260._16_8_;
      (((secp256k1_gej *)r)->y).n[3] = uVar6 + auStack_260._24_8_;
      puVar1 = (((secp256k1_gej *)r)->y).n + 4;
      *puVar1 = *puVar1 + auStack_260._32_8_;
      (((secp256k1_gej *)r)->y).magnitude = iVar7;
      (((secp256k1_gej *)r)->y).normalized = 0;
      goto LAB_00148b41;
    }
  }
  else {
    psStack_278 = (secp256k1_fe *)0x149265;
    secp256k1_gej_add_zinv_var_cold_7();
LAB_00149265:
    psStack_278 = (secp256k1_fe *)0x14926a;
    secp256k1_gej_add_zinv_var_cold_6();
LAB_0014926a:
    psStack_278 = (secp256k1_fe *)0x14926f;
    secp256k1_gej_add_zinv_var_cold_5();
LAB_0014926f:
    psStack_278 = (secp256k1_fe *)0x149274;
    secp256k1_gej_add_zinv_var_cold_4();
LAB_00149274:
    psStack_278 = (secp256k1_fe *)0x149279;
    secp256k1_gej_add_zinv_var_cold_3();
LAB_00149279:
    psStack_278 = (secp256k1_fe *)0x14927e;
    secp256k1_gej_add_zinv_var_cold_2();
  }
  psStack_278 = (secp256k1_fe *)secp256k1_scalar_cadd_bit;
  secp256k1_gej_add_zinv_var_cold_1();
  uVar8 = (ulong)psVar13 & 0xffffffff;
  pcStack_290 = (code *)0x149294;
  psVar15 = psVar13;
  r_01 = r_00;
  psStack_280 = (secp256k1_gej *)r;
  psStack_278 = a_01;
  iStack_284 = extraout_EDX;
  secp256k1_scalar_verify((secp256k1_scalar *)r_00);
  if ((uint)psVar13 < 0x100) {
    uVar10 = iStack_284 - 1U & 0x100 | (uint)psVar13;
    uVar11 = uVar10 >> 6;
    bVar9 = (byte)uVar8;
    uVar14 = (ulong)(uVar10 < 0x40) << (bVar9 & 0x3f);
    psVar15 = (secp256k1_gej *)((ulong)(uVar11 == 1) << (bVar9 & 0x3f));
    uVar17 = (ulong)(uVar11 == 2) << (bVar9 & 0x3f);
    uVar18 = (ulong)(uVar11 == 3) << (bVar9 & 0x3f);
    uVar12 = (r_00->x).n[0];
    (r_00->x).n[0] = (r_00->x).n[0] + uVar14;
    puVar1 = (r_00->x).n + 1;
    uVar14 = (ulong)CARRY8(uVar12,uVar14);
    uVar12 = *puVar1;
    uVar16 = (long)(psVar15->x).n + *puVar1;
    *puVar1 = uVar16 + uVar14;
    puVar1 = (r_00->x).n + 2;
    uVar14 = (ulong)(CARRY8(uVar12,(ulong)psVar15) || CARRY8(uVar16,uVar14));
    uVar12 = *puVar1;
    uVar16 = *puVar1 + uVar17;
    *puVar1 = uVar16 + uVar14;
    puVar1 = (r_00->x).n + 3;
    uVar14 = (ulong)(CARRY8(uVar12,uVar17) || CARRY8(uVar16,uVar14));
    uVar12 = *puVar1;
    uVar16 = *puVar1 + uVar18;
    *puVar1 = uVar16 + uVar14;
    bVar2 = !CARRY8(uVar12,uVar18);
    bVar3 = !CARRY8(uVar16,uVar14);
    uVar8 = CONCAT71((int7)(uVar8 >> 8),bVar2 && bVar3);
    pcStack_290 = (code *)0x1492fc;
    r_01 = r_00;
    secp256k1_scalar_verify((secp256k1_scalar *)r_00);
    if (bVar2 && bVar3) {
      return;
    }
  }
  else {
    pcStack_290 = (code *)0x14930d;
    secp256k1_scalar_cadd_bit_cold_2();
  }
  pcStack_290 = secp256k1_scalar_get_bits_var;
  secp256k1_scalar_cadd_bit_cold_1();
  psStack_2b8 = (secp256k1_gej *)0x149326;
  psVar13 = psVar15;
  a_02 = r_01;
  psStack_2a8 = r_00;
  psStack_2a0 = (secp256k1_gej *)pre;
  psStack_298 = a_05;
  pcStack_290 = (code *)uVar8;
  secp256k1_scalar_verify((secp256k1_scalar *)r_01);
  if (extraout_EDX_00 - 0x21 < 0xffffffe0) {
    psStack_2b8 = (secp256k1_gej *)0x14939e;
    secp256k1_scalar_get_bits_var_cold_4();
LAB_0014939e:
    psStack_2b8 = (secp256k1_gej *)0x1493a3;
    secp256k1_scalar_get_bits_var_cold_3();
  }
  else {
    uVar10 = (uint)psVar15;
    if (0x100 < extraout_EDX_00 + uVar10) goto LAB_0014939e;
    uVar11 = (uint)(((ulong)psVar15 & 0xffffffff) >> 6);
    if ((extraout_EDX_00 + uVar10) - 1 >> 6 != uVar11) {
      if (uVar10 < 0xc0) {
        return;
      }
      goto LAB_001493a8;
    }
    psStack_2b8 = (secp256k1_gej *)0x149350;
    a_02 = r_01;
    secp256k1_scalar_verify((secp256k1_scalar *)r_01);
    if ((extraout_EDX_00 + uVar10) - 1 >> 6 == uVar11) {
      return;
    }
  }
  psStack_2b8 = (secp256k1_gej *)0x1493a8;
  secp256k1_scalar_get_bits_var_cold_2();
LAB_001493a8:
  psStack_2b8 = (secp256k1_gej *)secp256k1_ge_set_gej_zinv;
  secp256k1_scalar_get_bits_var_cold_1();
  uStack_2d8 = (ulong)extraout_EDX_00;
  psStack_2d0 = a_04;
  psStack_2c8 = psVar19;
  uStack_2c0 = (ulong)psVar15 & 0xffffffff;
  psStack_2b8 = r_01;
  secp256k1_gej_verify(psVar13);
  a_03 = a_00;
  secp256k1_fe_verify(&a_00->x);
  if (psVar13->infinity == 0) {
    secp256k1_fe_sqr(&sStack_308,&a_00->x);
    secp256k1_fe_mul(&sStack_338,&sStack_308,&a_00->x);
    secp256k1_fe_mul(&a_02->x,&psVar13->x,&sStack_308);
    secp256k1_fe_mul(&a_02->y,&psVar13->y,&sStack_338);
    *(int *)(a_02->z).n = psVar13->infinity;
    secp256k1_ge_verify((secp256k1_ge *)a_02);
    return;
  }
  secp256k1_ge_set_gej_zinv_cold_1();
  a_03->infinity = 1;
  (a_03->x).n[0] = 0;
  (a_03->x).n[1] = 0;
  (a_03->x).n[2] = 0;
  (a_03->x).n[3] = 0;
  *(undefined8 *)((long)(a_03->x).n + 0x1c) = 0;
  *(undefined8 *)((long)(a_03->x).n + 0x24) = 0;
  (a_03->x).normalized = 1;
  secp256k1_fe_verify(&a_03->x);
  *(undefined8 *)((long)(a_03->y).n + 0x1c) = 0;
  *(undefined8 *)((long)(a_03->y).n + 0x24) = 0;
  (a_03->y).n[2] = 0;
  (a_03->y).n[3] = 0;
  (a_03->y).n[0] = 0;
  (a_03->y).n[1] = 0;
  (a_03->y).normalized = 1;
  secp256k1_fe_verify(&a_03->y);
  secp256k1_ge_verify(a_03);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_ecmult_table_get_ge_storage(secp256k1_ge *r, const secp256k1_ge_storage *pre, int n, int w) {
    secp256k1_ecmult_table_verify(n,w);
    if (n > 0) {
        secp256k1_ge_from_storage(r, &pre[(n-1)/2]);
    } else {
        secp256k1_ge_from_storage(r, &pre[(-n-1)/2]);
        secp256k1_fe_negate(&(r->y), &(r->y), 1);
    }
}